

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<const_void_*>::setCapacity(Vector<const_void_*> *this,size_t newSize)

{
  void *__src;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *pRVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  ulong __n;
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> newBuilder;
  ArrayBuilder<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> local_38;
  
  if (newSize < (ulong)(*(long *)(this + 8) - *(long *)this >> 3)) {
    *(size_t *)(this + 8) = *(long *)this + newSize * 8;
  }
  pEVar3 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                              (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = (Entry *)(&pEVar3->key + newSize);
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  __src = *(void **)this;
  local_38.ptr = pEVar3;
  if (__src != *(void **)(this + 8)) {
    __n = (long)*(void **)(this + 8) - (long)__src & 0xfffffffffffffff8;
    local_38.pos = pEVar3;
    memcpy(pEVar3,__src,__n);
    pEVar3 = (Entry *)((long)&pEVar3->key + __n);
  }
  local_38.pos = pEVar3;
  ArrayBuilder<const_void_*>::operator=((ArrayBuilder<const_void_*> *)this,&local_38);
  pEVar2 = local_38.endPtr;
  pRVar1 = local_38.pos;
  pEVar3 = local_38.ptr;
  if (local_38.ptr != (Entry *)0x0) {
    local_38.ptr = (Entry *)0x0;
    local_38.pos = (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
    local_38.endPtr = (Entry *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar3,8,(long)pRVar1 - (long)pEVar3 >> 3,
               (long)pEVar2 - (long)pEVar3 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }